

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

StructReader * __thiscall
capnp::_::StructBuilder::asReader(StructReader *__return_storage_ptr__,StructBuilder *this)

{
  StructPointerCount pointerCount;
  StructDataBitCount dataSize;
  SegmentBuilder *segment;
  CapTableReader *capTable;
  void *data;
  WirePointer *pointers;
  int nestingLimit;
  StructBuilder *this_local;
  
  segment = this->segment;
  capTable = &this->capTable->super_CapTableReader;
  data = this->data;
  pointers = this->pointers;
  dataSize = this->dataSize;
  pointerCount = this->pointerCount;
  nestingLimit = kj::MaxValue_::operator_cast_to_int((MaxValue_ *)&kj::maxValue);
  StructReader::StructReader
            (__return_storage_ptr__,&segment->super_SegmentReader,capTable,data,pointers,dataSize,
             pointerCount,nestingLimit);
  return __return_storage_ptr__;
}

Assistant:

StructReader StructBuilder::asReader() const {
  return StructReader(segment, capTable, data, pointers,
      dataSize, pointerCount, kj::maxValue);
}